

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable.hxx
# Opt level: O3

void __thiscall
cmsys::
hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
::erase(hashtable<std::pair<const_char_*const,_int>,_const_char_*,_cmsys::hash<const_char_*>,_cmsys::hash_select1st<const_char_*const,_int>,_std::equal_to<const_char_*>,_std::allocator<char>_>
        *this,iterator __first,iterator __last)

{
  ulong uVar1;
  ulong uVar2;
  _Node *__last_00;
  char *pcVar3;
  _Node *__first_00;
  pointer pp_Var4;
  char cVar5;
  size_type __n;
  pointer pp_Var6;
  
  __last_00 = __last._M_cur;
  __first_00 = __first._M_cur;
  if (__first_00 == (_Node *)0x0) {
    pp_Var4 = (this->_M_buckets).
              super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pp_Var6 = (this->_M_buckets).
              super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    uVar1 = (long)pp_Var6 - (long)pp_Var4 >> 3;
  }
  else {
    pp_Var4 = (this->_M_buckets).
              super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pp_Var6 = (this->_M_buckets).
              super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    pcVar3 = (__first_00->_M_val).first;
    cVar5 = *pcVar3;
    if (cVar5 == '\0') {
      uVar1 = 0;
    }
    else {
      uVar1 = 0;
      do {
        pcVar3 = pcVar3 + 1;
        uVar1 = (long)cVar5 + uVar1 * 5;
        cVar5 = *pcVar3;
      } while (cVar5 != '\0');
    }
    uVar1 = uVar1 % (ulong)((long)pp_Var6 - (long)pp_Var4 >> 3);
  }
  if (__last_00 == (_Node *)0x0) {
    uVar2 = (long)pp_Var6 - (long)pp_Var4 >> 3;
  }
  else {
    pcVar3 = (__last_00->_M_val).first;
    cVar5 = *pcVar3;
    if (cVar5 == '\0') {
      uVar2 = 0;
    }
    else {
      uVar2 = 0;
      do {
        pcVar3 = pcVar3 + 1;
        uVar2 = (long)cVar5 + uVar2 * 5;
        cVar5 = *pcVar3;
      } while (cVar5 != '\0');
    }
    uVar2 = uVar2 % (ulong)((long)pp_Var6 - (long)pp_Var4 >> 3);
  }
  if (__first_00 != __last_00) {
    if (uVar1 == uVar2) {
      _M_erase_bucket(this,uVar1,__first_00,__last_00);
      return;
    }
    _M_erase_bucket(this,uVar1,__first_00,(_Node *)0x0);
    __n = uVar1 + 1;
    if (__n < uVar2) {
      do {
        _M_erase_bucket(this,__n,(_Node *)0x0);
        __n = __n + 1;
      } while (uVar2 != __n);
    }
    if (uVar2 != (long)(this->_M_buckets).
                       super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(this->_M_buckets).
                       super__Vector_base<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*,_std::allocator<cmsys::_Hashtable_node<std::pair<const_char_*const,_int>_>_*>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 3) {
      _M_erase_bucket(this,uVar2,__last_00);
      return;
    }
  }
  return;
}

Assistant:

void hashtable<_Val, _Key, _HF, _Ex, _Eq, _All>::erase(iterator __first,
                                                       iterator __last)
{
  size_type __f_bucket =
    __first._M_cur ? _M_bkt_num(__first._M_cur->_M_val) : _M_buckets.size();
  size_type __l_bucket =
    __last._M_cur ? _M_bkt_num(__last._M_cur->_M_val) : _M_buckets.size();

  if (__first._M_cur == __last._M_cur)
    return;
  else if (__f_bucket == __l_bucket)
    _M_erase_bucket(__f_bucket, __first._M_cur, __last._M_cur);
  else {
    _M_erase_bucket(__f_bucket, __first._M_cur, 0);
    for (size_type __n = __f_bucket + 1; __n < __l_bucket; ++__n)
      _M_erase_bucket(__n, 0);
    if (__l_bucket != _M_buckets.size())
      _M_erase_bucket(__l_bucket, __last._M_cur);
  }
}